

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O2

void __thiscall
Diligent::GLContextState::SetBlendState
          (GLContextState *this,BlendStateDesc *BSDsc,Uint32 RenderTargetMask,Uint32 SampleMask)

{
  Bool BVar1;
  byte bVar2;
  LOGIC_OPERATION LVar3;
  uint uVar4;
  Uint32 UVar5;
  byte bVar6;
  GLenum GVar7;
  GLenum GVar8;
  GLenum GVar9;
  GLenum GVar10;
  char *pcVar11;
  BlendStateDesc *pBVar12;
  BlendStateDesc *pBVar13;
  LOGIC_OPERATION *pLVar14;
  Uint32 UVar15;
  GLuint GVar16;
  char (*in_R8) [63];
  bool bVar17;
  Uint32 UVar18;
  undefined8 unaff_R15;
  GLint *in_stack_ffffffffffffff68;
  GLint *Args_4;
  GLenum err;
  Uint32 RenderTargetMask_local;
  string _msg;
  GLenum err_3;
  BlendStateDesc *local_58;
  uint local_4c;
  GLint *local_48;
  GLContextState *local_40;
  BlendStateDesc *local_38;
  
  RenderTargetMask_local = RenderTargetMask;
  local_40 = this;
  if (SampleMask != 0xffffffff) {
    FormatString<char[55]>
              (&_msg,(char (*) [55])"Sample mask is not currently implemented in GL backend");
    if (DebugMessageCallback != (undefined *)0x0) {
      in_R8 = (char (*) [63])0x0;
      (*(code *)DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0);
    }
    std::__cxx11::string::~string((string *)&_msg);
  }
  BVar1 = BSDsc->RenderTargets[0].BlendEnable;
  if (0xff < RenderTargetMask_local) {
    FormatString<char[21],unsigned_int,char[63]>
              (&_msg,(Diligent *)"Render target mask (",(char (*) [21])&RenderTargetMask_local,
               (uint *)") contains bits that correspond to non-existent render targets",in_R8);
    DebugAssertionFailed
              (_msg._M_dataplus._M_p,"SetBlendState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x2db);
    std::__cxx11::string::~string((string *)&_msg);
    RenderTargetMask_local = RenderTargetMask_local & 0xff;
  }
  Args_4 = &(local_40->m_Caps).MaxDrawBuffers;
  bVar6 = (byte)(local_40->m_Caps).MaxDrawBuffers;
  pBVar12 = (BlendStateDesc *)CONCAT71((int7)((ulong)local_40 >> 8),bVar6);
  local_4c = (uint)CONCAT71((int7)((ulong)unaff_R15 >> 8),BVar1);
  local_48 = Args_4;
  if (RenderTargetMask_local >> (bVar6 & 0x1f) != 0) {
    if (RenderTargetMask_local == 0) {
      err = 0x20;
    }
    else {
      err = 0;
      if (RenderTargetMask_local != 0) {
        for (; (RenderTargetMask_local >> err & 1) == 0; err = err + 1) {
        }
      }
    }
    pcVar11 = ") contains buffer ";
    FormatString<char[21],unsigned_int,char[19],unsigned_int,char[32],int,char[14]>
              (&_msg,(Diligent *)"Render target mask (",(char (*) [21])&RenderTargetMask_local,
               (uint *)") contains buffer ",(char (*) [19])&err,
               (uint *)" but this device only supports ",(char (*) [32])Args_4,
               (int *)" draw buffers",(char (*) [14])CONCAT44(RenderTargetMask_local,err));
    in_stack_ffffffffffffff68 = Args_4;
    if (DebugMessageCallback != (undefined *)0x0) {
      pcVar11 = (char *)0x0;
      (*(code *)DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0,0);
      in_stack_ffffffffffffff68 = Args_4;
    }
    std::__cxx11::string::~string((string *)&_msg);
    pBVar12 = (BlendStateDesc *)CONCAT71((int7)((ulong)pcVar11 >> 8),(byte)*local_48);
    RenderTargetMask_local = ~(-1 << ((byte)*local_48 & 0x1f)) & RenderTargetMask_local;
  }
  pBVar13 = (BlendStateDesc *)BSDsc->RenderTargets;
  UVar18 = 0;
  bVar17 = false;
  UVar15 = RenderTargetMask_local;
  local_58 = pBVar13;
  local_38 = BSDsc;
  while (bVar6 = (byte)UVar18, UVar15 != 0) {
    uVar4 = 0;
    if (UVar15 != 0) {
      for (; (UVar15 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
      }
    }
    if ((7 < uVar4) || (*local_48 <= (int)uVar4)) {
      FormatString<char[26],char[72]>
                (&_msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "rt < MAX_RENDER_TARGETS && static_cast<int>(rt) < m_Caps.MaxDrawBuffers",
                 &pBVar12->AlphaToCoverageEnable);
      DebugAssertionFailed
                (_msg._M_dataplus._M_p,"SetBlendState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x2e9);
      std::__cxx11::string::~string((string *)&_msg);
      pBVar13 = local_58;
    }
    if (pBVar13->RenderTargets[uVar4].BlendOpAlpha == BLEND_OPERATION_UNDEFINED) {
      FormatString<char[103]>
                (&_msg,(char (*) [103])
                       "Render target write mask should not be COLOR_MASK_NONE if corresponding bit is set in RenderTargetMask"
                );
      DebugAssertionFailed
                (_msg._M_dataplus._M_p,"SetBlendState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x2ec);
      std::__cxx11::string::~string((string *)&_msg);
      pBVar13 = local_58;
    }
    UVar15 = UVar15 & ~(1 << (uVar4 & 0x1f));
    pLVar14 = &pBVar13->RenderTargets[(ulong)uVar4 - 1].LogicOp;
    bVar2 = pLVar14[9];
    UVar5 = (uint)bVar2;
    if (bVar6 != 0) {
      bVar17 = (bool)(bVar6 != bVar2 | bVar17);
      UVar5 = UVar18;
    }
    UVar18 = UVar5;
    pBVar12 = local_38;
    if (local_38->IndependentBlendEnable == true) {
      pBVar12 = (BlendStateDesc *)(ulong)(local_4c & 0xff);
      if (*pLVar14 != LOGIC_OP_CLEAR) {
        pBVar12 = (BlendStateDesc *)0x1;
      }
      local_4c = (uint)pBVar12;
    }
  }
  if (bVar17) {
    for (UVar18 = RenderTargetMask_local; UVar18 != 0; UVar18 = UVar18 & ~(1 << (uVar4 & 0x1f))) {
      uVar4 = 0;
      if (UVar18 != 0) {
        for (; (UVar18 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
        }
      }
      if ((7 < uVar4) || (*local_48 <= (int)uVar4)) {
        FormatString<char[26],char[72]>
                  (&_msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])
                   "rt < MAX_RENDER_TARGETS && static_cast<int>(rt) < m_Caps.MaxDrawBuffers",
                   &pBVar12->AlphaToCoverageEnable);
        DebugAssertionFailed
                  (_msg._M_dataplus._M_p,"SetBlendState",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                   ,0x300);
        std::__cxx11::string::~string((string *)&_msg);
      }
      pBVar12 = local_58;
      SetColorWriteMaskIndexed(local_40,uVar4,(uint)local_58->RenderTargets[uVar4].BlendOpAlpha);
    }
  }
  else if (bVar6 != 0) {
    SetColorWriteMask(local_40,UVar18);
  }
  if ((local_4c & 1) == 0) {
    glDisable();
    err = glGetError();
    if (err == 0) {
      return;
    }
    LogError<false,char[33],char[17],unsigned_int>
              (false,"SetBlendState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x354,(char (*) [33])"Failed to disable alpha blending",
               (char (*) [17])"\nGL Error Code: ",&err);
    FormatString<char[6]>(&_msg,(char (*) [6])0x2b552e);
    DebugAssertionFailed
              (_msg._M_dataplus._M_p,"SetBlendState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x354);
    goto LAB_0015c24f;
  }
  glEnable();
  err = glGetError();
  pBVar12 = local_38;
  if (err != 0) {
    in_stack_ffffffffffffff68 = (GLint *)&err;
    LogError<false,char[32],char[17],unsigned_int>
              (false,"SetBlendState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x30e,(char (*) [32])"Failed to enable alpha blending",
               (char (*) [17])"\nGL Error Code: ",(uint *)in_stack_ffffffffffffff68);
    FormatString<char[6]>(&_msg,(char (*) [6])0x2b552e);
    DebugAssertionFailed
              (_msg._M_dataplus._M_p,"SetBlendState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x30e);
    std::__cxx11::string::~string((string *)&_msg);
  }
  if (pBVar12->AlphaToCoverageEnable == true) {
    glEnable();
    err = glGetError();
    if (err != 0) {
      in_stack_ffffffffffffff68 = (GLint *)&err;
      LogError<false,char[35],char[17],unsigned_int>
                (false,"SetBlendState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x313,(char (*) [35])"Failed to enable alpha to coverage",
                 (char (*) [17])"\nGL Error Code: ",(uint *)in_stack_ffffffffffffff68);
      FormatString<char[6]>(&_msg,(char (*) [6])0x2b552e);
      DebugAssertionFailed
                (_msg._M_dataplus._M_p,"SetBlendState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x313);
LAB_0015be29:
      std::__cxx11::string::~string((string *)&_msg);
    }
  }
  else {
    glDisable();
    err = glGetError();
    if (err != 0) {
      in_stack_ffffffffffffff68 = (GLint *)&err;
      LogError<false,char[36],char[17],unsigned_int>
                (false,"SetBlendState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x318,(char (*) [36])"Failed to disable alpha to coverage",
                 (char (*) [17])"\nGL Error Code: ",(uint *)in_stack_ffffffffffffff68);
      FormatString<char[6]>(&_msg,(char (*) [6])0x2b552e);
      DebugAssertionFailed
                (_msg._M_dataplus._M_p,"SetBlendState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x318);
      goto LAB_0015be29;
    }
  }
  if (pBVar12->IndependentBlendEnable == true) {
    GVar16 = 0;
    pBVar12 = local_58;
    do {
      if (7 < (int)GVar16) {
        return;
      }
      LVar3 = pBVar12->RenderTargets[(long)(int)GVar16 + -1].LogicOp;
      err = GVar16;
      if ((int)GVar16 < *local_48) {
        if (LVar3 == LOGIC_OP_CLEAR) {
          (*__glewDisablei)(0xbe2,GVar16);
          err_3 = glGetError();
          pBVar12 = local_58;
          if (err_3 != 0) {
            in_stack_ffffffffffffff68 = (GLint *)&err_3;
            LogError<false,char[33],char[17],unsigned_int>
                      (false,"SetBlendState",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                       ,0x33b,(char (*) [33])"Failed to disable alpha blending",
                       (char (*) [17])"\nGL Error Code: ",&err_3);
            FormatString<char[6]>(&_msg,(char (*) [6])0x2b552e);
            DebugAssertionFailed
                      (_msg._M_dataplus._M_p,"SetBlendState",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                       ,0x33b);
            goto LAB_0015c0f2;
          }
        }
        else {
          (*__glewEnablei)(0xbe2,GVar16);
          err_3 = glGetError();
          if (err_3 != 0) {
            in_stack_ffffffffffffff68 = (GLint *)&err_3;
            LogError<false,char[32],char[17],unsigned_int>
                      (false,"SetBlendState",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                       ,0x32b,(char (*) [32])"Failed to enable alpha blending",
                       (char (*) [17])"\nGL Error Code: ",&err_3);
            FormatString<char[6]>(&_msg,(char (*) [6])0x2b552e);
            DebugAssertionFailed
                      (_msg._M_dataplus._M_p,"SetBlendState",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                       ,0x32b);
            std::__cxx11::string::~string((string *)&_msg);
          }
          pBVar12 = local_58;
          GVar7 = BlendFactor2GLBlend(local_58->RenderTargets[(int)GVar16].BlendEnable);
          local_38 = (BlendStateDesc *)CONCAT44(local_38._4_4_,GVar7);
          GVar7 = BlendFactor2GLBlend(pBVar12->RenderTargets[(int)GVar16].LogicOperationEnable);
          local_40 = (GLContextState *)CONCAT44(local_40._4_4_,GVar7);
          GVar7 = BlendFactor2GLBlend(pBVar12->RenderTargets[(int)GVar16].DestBlend);
          GVar8 = BlendFactor2GLBlend(pBVar12->RenderTargets[(int)GVar16].BlendOp);
          (*__glewBlendFuncSeparatei)(err,(GLenum)local_38,(GLenum)local_40,GVar7,GVar8);
          err_3 = glGetError();
          if (err_3 != 0) {
            in_stack_ffffffffffffff68 = (GLint *)&err_3;
            LogError<false,char[40],char[17],unsigned_int>
                      (false,"SetBlendState",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                       ,0x332,(char (*) [40])"Failed to set separate blending factors",
                       (char (*) [17])"\nGL Error Code: ",&err_3);
            FormatString<char[6]>(&_msg,(char (*) [6])0x2b552e);
            DebugAssertionFailed
                      (_msg._M_dataplus._M_p,"SetBlendState",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                       ,0x332);
            std::__cxx11::string::~string((string *)&_msg);
          }
          GVar7 = BlendOperation2GLBlendOp(pBVar12->RenderTargets[(int)GVar16].SrcBlend);
          GVar8 = BlendOperation2GLBlendOp(pBVar12->RenderTargets[(int)GVar16].SrcBlendAlpha);
          (*__glewBlendEquationSeparatei)(err,GVar7,GVar8);
          err_3 = glGetError();
          pBVar12 = local_58;
          if (err_3 != 0) {
            in_stack_ffffffffffffff68 = (GLint *)&err_3;
            LogError<false,char[42],char[17],unsigned_int>
                      (false,"SetBlendState",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                       ,0x336,(char (*) [42])"Failed to set separate blending equations",
                       (char (*) [17])"\nGL Error Code: ",&err_3);
            FormatString<char[6]>(&_msg,(char (*) [6])0x2b552e);
            DebugAssertionFailed
                      (_msg._M_dataplus._M_p,"SetBlendState",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                       ,0x336);
LAB_0015c0f2:
            std::__cxx11::string::~string((string *)&_msg);
            pBVar12 = local_58;
          }
        }
      }
      else if (LVar3 != LOGIC_OP_CLEAR) {
        FormatString<char[36],int,char[32],int,char[14]>
                  (&_msg,(Diligent *)"Blend is enabled for render target ",(char (*) [36])&err,
                   (int *)" but this device only supports ",(char (*) [32])local_48,
                   (int *)" draw buffers",(char (*) [14])in_stack_ffffffffffffff68);
        if (DebugMessageCallback != (undefined *)0x0) {
          (*(code *)DebugMessageCallback)(2,_msg._M_dataplus._M_p,0,0,0);
        }
        goto LAB_0015c0f2;
      }
      GVar16 = err + 1;
    } while( true );
  }
  GVar7 = BlendFactor2GLBlend(pBVar12->RenderTargets[0].SrcBlend);
  GVar8 = BlendFactor2GLBlend(pBVar12->RenderTargets[0].DestBlend);
  GVar9 = BlendFactor2GLBlend(pBVar12->RenderTargets[0].SrcBlendAlpha);
  GVar10 = BlendFactor2GLBlend(pBVar12->RenderTargets[0].DestBlendAlpha);
  (*__glewBlendFuncSeparate)(GVar7,GVar8,GVar9,GVar10);
  err = glGetError();
  if (err != 0) {
    LogError<false,char[31],char[17],unsigned_int>
              (false,"SetBlendState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x348,(char (*) [31])"Failed to set blending factors",
               (char (*) [17])"\nGL Error Code: ",&err);
    FormatString<char[6]>(&_msg,(char (*) [6])0x2b552e);
    DebugAssertionFailed
              (_msg._M_dataplus._M_p,"SetBlendState",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x348);
    std::__cxx11::string::~string((string *)&_msg);
  }
  GVar7 = BlendOperation2GLBlendOp(pBVar12->RenderTargets[0].BlendOp);
  GVar8 = BlendOperation2GLBlendOp(pBVar12->RenderTargets[0].BlendOpAlpha);
  (*__glewBlendEquationSeparate)(GVar7,GVar8);
  err = glGetError();
  if (err == 0) {
    return;
  }
  LogError<false,char[33],char[17],unsigned_int>
            (false,"SetBlendState",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
             ,0x34d,(char (*) [33])"Failed to set blending equations",
             (char (*) [17])"\nGL Error Code: ",&err);
  FormatString<char[6]>(&_msg,(char (*) [6])0x2b552e);
  DebugAssertionFailed
            (_msg._M_dataplus._M_p,"SetBlendState",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
             ,0x34d);
LAB_0015c24f:
  std::__cxx11::string::~string((string *)&_msg);
  return;
}

Assistant:

void GLContextState::SetBlendState(const BlendStateDesc& BSDsc, Uint32 RenderTargetMask, Uint32 SampleMask)
{
    if (SampleMask != 0xFFFFFFFF)
        LOG_ERROR_MESSAGE("Sample mask is not currently implemented in GL backend");

    bool       bEnableBlend               = BSDsc.RenderTargets[0].BlendEnable;
    bool       bUseIndexedColorWriteMasks = false;
    COLOR_MASK NonIndexedColorMask        = COLOR_MASK_NONE;

    if (RenderTargetMask & ~((1u << MAX_RENDER_TARGETS) - 1u))
    {
        UNEXPECTED("Render target mask (", RenderTargetMask, ") contains bits that correspond to non-existent render targets");
        RenderTargetMask &= (1u << MAX_RENDER_TARGETS) - 1u;
    }

    if (RenderTargetMask & ~((1u << m_Caps.MaxDrawBuffers) - 1u))
    {
        LOG_ERROR_MESSAGE("Render target mask (", RenderTargetMask, ") contains buffer ", PlatformMisc::GetLSB(RenderTargetMask), " but this device only supports ", m_Caps.MaxDrawBuffers, " draw buffers");
        RenderTargetMask &= (1u << m_Caps.MaxDrawBuffers) - 1u;
    }

    for (Uint32 Mask = RenderTargetMask; Mask != 0;)
    {
        Uint32 rt = PlatformMisc::GetLSB(Mask);
        Mask &= ~(1u << rt);
        VERIFY_EXPR(rt < MAX_RENDER_TARGETS && static_cast<int>(rt) < m_Caps.MaxDrawBuffers);

        const RenderTargetBlendDesc& RT = BSDsc.RenderTargets[rt];
        VERIFY(RT.RenderTargetWriteMask != COLOR_MASK_NONE, "Render target write mask should not be COLOR_MASK_NONE if corresponding bit is set in RenderTargetMask");
        if (NonIndexedColorMask == COLOR_MASK_NONE)
        {
            NonIndexedColorMask = RT.RenderTargetWriteMask;
        }
        else if (NonIndexedColorMask != RT.RenderTargetWriteMask)
        {
            bUseIndexedColorWriteMasks = true;
        }

        if (BSDsc.IndependentBlendEnable && RT.BlendEnable)
            bEnableBlend = true;
    }

    if (bUseIndexedColorWriteMasks)
    {
        for (Uint32 Mask = RenderTargetMask; Mask != 0;)
        {
            Uint32 rt = PlatformMisc::GetLSB(Mask);
            Mask &= ~(1u << rt);
            VERIFY_EXPR(rt < MAX_RENDER_TARGETS && static_cast<int>(rt) < m_Caps.MaxDrawBuffers);
            SetColorWriteMaskIndexed(rt, BSDsc.RenderTargets[rt].RenderTargetWriteMask);
        }
    }
    else if (NonIndexedColorMask != COLOR_MASK_NONE)
    {
        // If the color write mask is COLOR_MASK_NONE, the draw buffer is disabled with glDrawBuffer.
        SetColorWriteMask(NonIndexedColorMask);
    }

    if (bEnableBlend)
    {
        //  Sets the blend enable flag for ALL color buffers.
        glEnable(GL_BLEND);
        DEV_CHECK_GL_ERROR("Failed to enable alpha blending");

        if (BSDsc.AlphaToCoverageEnable)
        {
            glEnable(GL_SAMPLE_ALPHA_TO_COVERAGE);
            DEV_CHECK_GL_ERROR("Failed to enable alpha to coverage");
        }
        else
        {
            glDisable(GL_SAMPLE_ALPHA_TO_COVERAGE);
            DEV_CHECK_GL_ERROR("Failed to disable alpha to coverage");
        }

        if (BSDsc.IndependentBlendEnable)
        {
            for (int i = 0; i < static_cast<int>(MAX_RENDER_TARGETS); ++i)
            {
                const RenderTargetBlendDesc& RT = BSDsc.RenderTargets[i];

                if (i >= m_Caps.MaxDrawBuffers)
                {
                    if (RT.BlendEnable)
                        LOG_ERROR_MESSAGE("Blend is enabled for render target ", i, " but this device only supports ", m_Caps.MaxDrawBuffers, " draw buffers");
                    continue;
                }

                if (RT.BlendEnable)
                {
                    glEnablei(GL_BLEND, i);
                    DEV_CHECK_GL_ERROR("Failed to enable alpha blending");

                    GLenum srcFactorRGB   = BlendFactor2GLBlend(RT.SrcBlend);
                    GLenum dstFactorRGB   = BlendFactor2GLBlend(RT.DestBlend);
                    GLenum srcFactorAlpha = BlendFactor2GLBlend(RT.SrcBlendAlpha);
                    GLenum dstFactorAlpha = BlendFactor2GLBlend(RT.DestBlendAlpha);
                    glBlendFuncSeparatei(i, srcFactorRGB, dstFactorRGB, srcFactorAlpha, dstFactorAlpha);
                    DEV_CHECK_GL_ERROR("Failed to set separate blending factors");
                    GLenum modeRGB   = BlendOperation2GLBlendOp(RT.BlendOp);
                    GLenum modeAlpha = BlendOperation2GLBlendOp(RT.BlendOpAlpha);
                    glBlendEquationSeparatei(i, modeRGB, modeAlpha);
                    DEV_CHECK_GL_ERROR("Failed to set separate blending equations");
                }
                else
                {
                    glDisablei(GL_BLEND, i);
                    DEV_CHECK_GL_ERROR("Failed to disable alpha blending");
                }
            }
        }
        else
        {
            const RenderTargetBlendDesc& RT0 = BSDsc.RenderTargets[0];

            GLenum srcFactorRGB   = BlendFactor2GLBlend(RT0.SrcBlend);
            GLenum dstFactorRGB   = BlendFactor2GLBlend(RT0.DestBlend);
            GLenum srcFactorAlpha = BlendFactor2GLBlend(RT0.SrcBlendAlpha);
            GLenum dstFactorAlpha = BlendFactor2GLBlend(RT0.DestBlendAlpha);
            glBlendFuncSeparate(srcFactorRGB, dstFactorRGB, srcFactorAlpha, dstFactorAlpha);
            DEV_CHECK_GL_ERROR("Failed to set blending factors");

            GLenum modeRGB   = BlendOperation2GLBlendOp(RT0.BlendOp);
            GLenum modeAlpha = BlendOperation2GLBlendOp(RT0.BlendOpAlpha);
            glBlendEquationSeparate(modeRGB, modeAlpha);
            DEV_CHECK_GL_ERROR("Failed to set blending equations");
        }
    }
    else
    {
        //  Sets the blend disable flag for ALL color buffers.
        glDisable(GL_BLEND);
        DEV_CHECK_GL_ERROR("Failed to disable alpha blending");
    }
}